

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *vArray;
  Ivy_Obj_t *pObj_00;
  int i;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x183,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x184,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  vArray = Vec_PtrAlloc(10);
  Ivy_ObjCollectFanouts(p,pObj,vArray);
  for (i = 0; i < vArray->nSize; i = i + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(vArray,i);
    if (pObj_00 == (Ivy_Obj_t *)0x0) break;
    uVar1 = *(uint *)&pObj_00->field_0x8;
    if (((uVar1 & 0xf) != 2) && ((uVar1 & 0xf) != 4)) {
      uVar2 = Ivy_ObjLevelNew(pObj_00);
      if (uVar1 >> 0xb != uVar2) {
        *(uint *)&pObj_00->field_0x8 = uVar1 & 0x7ff | uVar2 << 0xb;
        Ivy_ObjUpdateLevel_rec(p,pObj_00);
      }
    }
  }
  Vec_PtrFree(vArray);
  return;
}

Assistant:

void Ivy_ObjUpdateLevel_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanout;
    Vec_Ptr_t * vFanouts;
    int i, LevelNew;
    assert( p->fFanout );
    assert( Ivy_ObjIsNode(pObj) );
    vFanouts = Vec_PtrAlloc( 10 );
    Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
    {
        if ( Ivy_ObjIsCo(pFanout) )
        {
//            assert( (int)Ivy_ObjFanin0(pFanout)->Level <= p->nLevelMax );
            continue;
        }
        LevelNew = Ivy_ObjLevelNew( pFanout );
        if ( (int)pFanout->Level == LevelNew )
            continue;
        pFanout->Level = LevelNew;
        Ivy_ObjUpdateLevel_rec( p, pFanout );
    }
    Vec_PtrFree( vFanouts );
}